

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void ssl_calc_finished_tls_sha384(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  char *pcVar1;
  mbedtls_ssl_session *pmVar2;
  long lVar3;
  uchar padbuf [48];
  mbedtls_sha512_context sha512;
  uchar local_138 [48];
  mbedtls_sha512_context local_108;
  
  pmVar2 = ssl->session_negotiate;
  if (pmVar2 == (mbedtls_ssl_session *)0x0) {
    pmVar2 = ssl->session;
  }
  mbedtls_sha512_init(&local_108);
  lVar3 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1329,"=> calc  finished tls sha384");
  mbedtls_sha512_clone(&local_108,&ssl->handshake->fin_sha512);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1335,"finished sha512 state",(uchar *)local_108.state,0x40);
  pcVar1 = "server finished";
  if (from == 0) {
    pcVar1 = "client finished";
  }
  mbedtls_sha512_finish(&local_108,local_138);
  (*ssl->handshake->tls_prf)(pmVar2->master,0x30,pcVar1,local_138,0x30,buf,0xc);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1341,"calc finished result",buf,0xc);
  mbedtls_sha512_free(&local_108);
  do {
    local_138[lVar3] = '\0';
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x30);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1347,"<= calc  finished");
  return;
}

Assistant:

static void ssl_calc_finished_tls_sha384(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    int len = 12;
    const char *sender;
    mbedtls_sha512_context sha512;
    unsigned char padbuf[48];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    mbedtls_sha512_init( &sha512 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished tls sha384" ) );

    mbedtls_sha512_clone( &sha512, &ssl->handshake->fin_sha512 );

    /*
     * TLSv1.2:
     *   hash = PRF( master, finished_label,
     *               Hash( handshake ) )[0.11]
     */

#if !defined(MBEDTLS_SHA512_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha512 state", (unsigned char *)
                   sha512.state, sizeof( sha512.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT )
             ? "client finished"
             : "server finished";

    mbedtls_sha512_finish( &sha512, padbuf );

    ssl->handshake->tls_prf( session->master, 48, sender,
                             padbuf, 48, buf, len );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, len );

    mbedtls_sha512_free( &sha512 );

    mbedtls_zeroize(  padbuf, sizeof( padbuf ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}